

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PaytableWisePharaohs5.cpp
# Opt level: O0

void __thiscall PaytableWisePharaohs5::PaytableWisePharaohs5Info(PaytableWisePharaohs5 *this)

{
  ostream *poVar1;
  reference pvVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  int local_104;
  int local_100;
  int j_9;
  int i_9;
  value_type_conflict2 local_f4 [4];
  int local_e4;
  int local_e0;
  int j_8;
  int i_8;
  int j_7;
  int i_7;
  value_type_conflict2 local_cc [4];
  int local_bc;
  int local_b8;
  int j_6;
  int i_6;
  int j_5;
  int i_5;
  value_type_conflict2 local_a4 [4];
  int local_94;
  int local_90;
  int j_4;
  int i_4;
  int j_3;
  int i_3;
  value_type_conflict2 local_7c [4];
  int local_6c;
  int local_68;
  int j_2;
  int i_2;
  int j_1;
  int i_1;
  value_type_conflict2 local_54 [4];
  int local_44;
  int local_40;
  int j;
  int i;
  undefined1 local_30 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  LinesVector;
  int col;
  int row;
  PaytableWisePharaohs5 *this_local;
  
  LinesVector.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
  LinesVector.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 5;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_30);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_30,
           (long)LinesVector.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  poVar1 = std::operator<<((ostream *)&std::cout,"********");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"PAYTABLE");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"********");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-------------------------------------------------------------------------------------------------------------------------------------------------------"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Number 1 is representing Woman Figure.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Number 2 is representing Man Figure.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Number 3 is representing Eye Figure.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Number 4 is representing Sphinx Figure.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Number 5 is representing Pharaoh Figure.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Number 6 is representing Scatter Figure.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-----------------------------------------------------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Woman Figure: 3 Figures: 3 Euro, 4 Figures: 4 Euro, 5 Figures: 5 Euro");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Man Figure: 3 Figures: 4 Euro, 4 Figures: 5 Euro, 5 Figures: 6 Euro");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Eye Figure: 3 Figures: 5 Euro, 4 Figures: 6 Euro, 5 Figures: 7 Euro");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Sphinx Figure: 3 Figures: 6 Euro, 4 Figures: 7 Euro, 5 Figures: 8 Euro")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Pharaoh Figure: 3 Figures: 7 Euro, 4 Figures: 8 Euro, 5 Figures: 9 Euro"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Scatter Figure: 5 Figures: 50 Euro");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-----------------------------------------------------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "All Pays are left to right on the selected Lines: line 1 to Line 5!");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Line wins are multiplied by the number of points bet on the winning line!"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Only the highest payline is paid!");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Scatters cannot be retriggered in Free Games!");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"--------------------------------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"This game has Jackpot and cannot be GAMBLED!");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Jackpot prize is 1 000 000 Euro!");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"--------------------------------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-------------------------------------------------------------------------------------------------------------------------------------------------------"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Line 1: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_40 = 0;
      local_40 <
      LinesVector.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_40 = local_40 + 1) {
    for (local_44 = 0;
        local_44 <
        (int)LinesVector.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage; local_44 = local_44 + 1) {
      if ((local_40 == 1) && (local_44 == 0)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,1);
        local_54[3] = 1;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,local_54 + 3);
      }
      else if ((local_40 == 1) && (local_44 == 1)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,1);
        local_54[2] = 1;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,local_54 + 2);
      }
      else if ((local_40 == 1) && (local_44 == 2)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,1);
        local_54[1] = 1;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,local_54 + 1);
      }
      else if ((local_40 == 1) && (local_44 == 3)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,1);
        local_54[0] = 1;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,local_54);
      }
      else if ((local_40 == 1) && (local_44 == 4)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,1);
        i_1 = 1;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,&i_1);
      }
      else {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,(long)local_40);
        j_1 = 0;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,&j_1);
      }
    }
  }
  for (i_2 = 0; uVar3 = (ulong)i_2,
      sVar4 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)local_30), uVar3 < sVar4; i_2 = i_2 + 1) {
    j_2 = 0;
    while( true ) {
      uVar3 = (ulong)j_2;
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_30,(long)i_2);
      sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar2);
      if (sVar4 <= uVar3) break;
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_30,(long)i_2);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)j_2);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar5);
      std::operator<<(poVar1,"   ");
      j_2 = j_2 + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-------------------------------------------------------------------------------------------------------------------------------------------------------"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *)local_30);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_30,
           (long)LinesVector.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  poVar1 = std::operator<<((ostream *)&std::cout,"Line 2: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_68 = 0;
      local_68 <
      LinesVector.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_68 = local_68 + 1) {
    for (local_6c = 0;
        local_6c <
        (int)LinesVector.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage; local_6c = local_6c + 1) {
      if ((local_68 == 0) && (local_6c == 0)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,0);
        local_7c[3] = 2;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,local_7c + 3);
      }
      else if ((local_68 == 0) && (local_6c == 1)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,0);
        local_7c[2] = 2;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,local_7c + 2);
      }
      else if ((local_68 == 0) && (local_6c == 2)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,0);
        local_7c[1] = 2;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,local_7c + 1);
      }
      else if ((local_68 == 0) && (local_6c == 3)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,0);
        local_7c[0] = 2;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,local_7c);
      }
      else if ((local_68 == 0) && (local_6c == 4)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,0);
        i_3 = 2;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,&i_3);
      }
      else {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,(long)local_68);
        j_3 = 0;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,&j_3);
      }
    }
  }
  for (i_4 = 0; uVar3 = (ulong)i_4,
      sVar4 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)local_30), uVar3 < sVar4; i_4 = i_4 + 1) {
    j_4 = 0;
    while( true ) {
      uVar3 = (ulong)j_4;
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_30,(long)i_4);
      sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar2);
      if (sVar4 <= uVar3) break;
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_30,(long)i_4);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)j_4);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar5);
      std::operator<<(poVar1,"   ");
      j_4 = j_4 + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-------------------------------------------------------------------------------------------------------------------------------------------------------"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *)local_30);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_30,
           (long)LinesVector.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  poVar1 = std::operator<<((ostream *)&std::cout,"Line 3: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_90 = 0;
      local_90 <
      LinesVector.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_90 = local_90 + 1) {
    for (local_94 = 0;
        local_94 <
        (int)LinesVector.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage; local_94 = local_94 + 1) {
      if ((local_90 == 2) && (local_94 == 0)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,2);
        local_a4[3] = 3;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,local_a4 + 3);
      }
      else if ((local_90 == 2) && (local_94 == 1)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,2);
        local_a4[2] = 3;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,local_a4 + 2);
      }
      else if ((local_90 == 2) && (local_94 == 2)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,2);
        local_a4[1] = 3;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,local_a4 + 1);
      }
      else if ((local_90 == 2) && (local_94 == 3)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,2);
        local_a4[0] = 3;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,local_a4);
      }
      else if ((local_90 == 2) && (local_94 == 4)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,2);
        i_5 = 3;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,&i_5);
      }
      else {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,(long)local_90);
        j_5 = 0;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,&j_5);
      }
    }
  }
  for (i_6 = 0; uVar3 = (ulong)i_6,
      sVar4 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)local_30), uVar3 < sVar4; i_6 = i_6 + 1) {
    j_6 = 0;
    while( true ) {
      uVar3 = (ulong)j_6;
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_30,(long)i_6);
      sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar2);
      if (sVar4 <= uVar3) break;
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_30,(long)i_6);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)j_6);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar5);
      std::operator<<(poVar1,"   ");
      j_6 = j_6 + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-------------------------------------------------------------------------------------------------------------------------------------------------------"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *)local_30);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_30,
           (long)LinesVector.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  poVar1 = std::operator<<((ostream *)&std::cout,"Line 4: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_b8 = 0;
      local_b8 <
      LinesVector.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_b8 = local_b8 + 1) {
    for (local_bc = 0;
        local_bc <
        (int)LinesVector.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage; local_bc = local_bc + 1) {
      if ((local_b8 == 0) && (local_bc == 0)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,0);
        local_cc[3] = 4;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,local_cc + 3);
      }
      else if ((local_b8 == 1) && (local_bc == 1)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,1);
        local_cc[2] = 4;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,local_cc + 2);
      }
      else if ((local_b8 == 2) && (local_bc == 2)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,2);
        local_cc[1] = 4;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,local_cc + 1);
      }
      else if ((local_b8 == 1) && (local_bc == 3)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,1);
        local_cc[0] = 4;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,local_cc);
      }
      else if ((local_b8 == 0) && (local_bc == 4)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,0);
        i_7 = 4;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,&i_7);
      }
      else {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,(long)local_b8);
        j_7 = 0;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,&j_7);
      }
    }
  }
  for (i_8 = 0; uVar3 = (ulong)i_8,
      sVar4 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)local_30), uVar3 < sVar4; i_8 = i_8 + 1) {
    j_8 = 0;
    while( true ) {
      uVar3 = (ulong)j_8;
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_30,(long)i_8);
      sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar2);
      if (sVar4 <= uVar3) break;
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_30,(long)i_8);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)j_8);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar5);
      std::operator<<(poVar1,"   ");
      j_8 = j_8 + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-------------------------------------------------------------------------------------------------------------------------------------------------------"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *)local_30);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_30,
           (long)LinesVector.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  poVar1 = std::operator<<((ostream *)&std::cout,"Line 5: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_e0 = 0;
      local_e0 <
      LinesVector.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_e0 = local_e0 + 1) {
    for (local_e4 = 0;
        local_e4 <
        (int)LinesVector.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage; local_e4 = local_e4 + 1) {
      if ((local_e0 == 2) && (local_e4 == 0)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,2);
        local_f4[3] = 5;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,local_f4 + 3);
      }
      else if ((local_e0 == 1) && (local_e4 == 1)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,1);
        local_f4[2] = 5;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,local_f4 + 2);
      }
      else if ((local_e0 == 0) && (local_e4 == 2)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,0);
        local_f4[1] = 5;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,local_f4 + 1);
      }
      else if ((local_e0 == 1) && (local_e4 == 3)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,1);
        local_f4[0] = 5;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,local_f4);
      }
      else if ((local_e0 == 2) && (local_e4 == 4)) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,2);
        i_9 = 5;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,&i_9);
      }
      else {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_30,(long)local_e0);
        j_9 = 0;
        std::vector<int,_std::allocator<int>_>::push_back(pvVar2,&j_9);
      }
    }
  }
  for (local_100 = 0;
      sVar4 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)local_30), (ulong)(long)local_100 < sVar4; local_100 = local_100 + 1) {
    local_104 = 0;
    while( true ) {
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_30,(long)local_100);
      sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar2);
      if (sVar4 <= (ulong)(long)local_104) break;
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_30,(long)local_100);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_104);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar5);
      std::operator<<(poVar1,"   ");
      local_104 = local_104 + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-------------------------------------------------------------------------------------------------------------------------------------------------------"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *)local_30);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_30);
  return;
}

Assistant:

void PaytableWisePharaohs5::PaytableWisePharaohs5Info() {
	int row = 3;
	int col = 5;
	std::vector<std::vector<int>> LinesVector;
	LinesVector.resize(row);

	std::cout << "********" << std::endl;
	std::cout << "PAYTABLE" << std::endl;
	std::cout << "********" << std::endl;
	std::cout << "-------------------------------------------------------------------------------------------------------------------------------------------------------" << std::endl;
	std::cout << "Number 1 is representing Woman Figure." << std::endl;
	std::cout << "Number 2 is representing Man Figure." << std::endl;
	std::cout << "Number 3 is representing Eye Figure." << std::endl;
	std::cout << "Number 4 is representing Sphinx Figure." << std::endl;
	std::cout << "Number 5 is representing Pharaoh Figure." << std::endl;
	std::cout << "Number 6 is representing Scatter Figure." << std::endl;
	std::cout << "-----------------------------------------------------------------" << std::endl;
	std::cout << "Woman Figure: 3 Figures: 3 Euro, 4 Figures: 4 Euro, 5 Figures: 5 Euro" << std::endl;
	std::cout << "Man Figure: 3 Figures: 4 Euro, 4 Figures: 5 Euro, 5 Figures: 6 Euro" << std::endl;
	std::cout << "Eye Figure: 3 Figures: 5 Euro, 4 Figures: 6 Euro, 5 Figures: 7 Euro" << std::endl;
	std::cout << "Sphinx Figure: 3 Figures: 6 Euro, 4 Figures: 7 Euro, 5 Figures: 8 Euro" << std::endl;
	std::cout << "Pharaoh Figure: 3 Figures: 7 Euro, 4 Figures: 8 Euro, 5 Figures: 9 Euro" << std::endl;
	std::cout << "Scatter Figure: 5 Figures: 50 Euro" << std::endl;
	std::cout << "-----------------------------------------------------------------" << std::endl;
	std::cout << "All Pays are left to right on the selected Lines: line 1 to Line 5!" << std::endl;
	std::cout << "Line wins are multiplied by the number of points bet on the winning line!" << std::endl;
	std::cout << "Only the highest payline is paid!" << std::endl;
	std::cout << "Scatters cannot be retriggered in Free Games!" << std::endl;
	std::cout << "--------------------------------------------" << std::endl;
	std::cout << "This game has Jackpot and cannot be GAMBLED!" << std::endl;
	std::cout << "Jackpot prize is 1 000 000 Euro!" << std::endl;
	std::cout << "--------------------------------------------" << std::endl;
	std::cout << "-------------------------------------------------------------------------------------------------------------------------------------------------------" << std::endl;
	std::cout << "Line 1: " << std::endl;
	for (int i = 0; i < row; ++i) {
		for (int j = 0; j < col; ++j) {
			if (i == 1 && j == 0) {
				LinesVector[i].push_back(1);
			}
			else
				if (i == 1 && j == 1) {
					LinesVector[i].push_back(1);
				}
				else
					if (i == 1 && j == 2) {
						LinesVector[i].push_back(1);
					}
					else
						if (i == 1 && j == 3) {
							LinesVector[i].push_back(1);
						}
						else
							if (i == 1 && j == 4) {
								LinesVector[i].push_back(1);
							}
							else {
								LinesVector[i].push_back(0);
							}
		}
	}
	for (int i = 0; i < LinesVector.size(); ++i) {
		for (int j = 0; j < LinesVector[i].size(); ++j) {
			std::cout << LinesVector[i][j] << "   ";
		}
		std::cout << std::endl;
	}
	std::cout << "-------------------------------------------------------------------------------------------------------------------------------------------------------" << std::endl;
	LinesVector.clear();
	LinesVector.resize(row);
	std::cout << "Line 2: " << std::endl;
	for (int i = 0; i < row; ++i) {
		for (int j = 0; j < col; ++j) {
			if (i == 0 && j == 0) {
				LinesVector[i].push_back(2);
			}
			else
				if (i == 0 && j == 1) {
					LinesVector[i].push_back(2);
				}
				else
					if (i == 0 && j == 2) {
						LinesVector[i].push_back(2);
					}
					else
						if (i == 0 && j == 3) {
							LinesVector[i].push_back(2);
						}
						else
							if (i == 0 && j == 4) {
								LinesVector[i].push_back(2);
							}
							else {
								LinesVector[i].push_back(0);
							}
		}
	}
	for (int i = 0; i < LinesVector.size(); ++i) {
		for (int j = 0; j < LinesVector[i].size(); ++j) {
			std::cout << LinesVector[i][j] << "   ";
		}
		std::cout << std::endl;
	}
	std::cout << "-------------------------------------------------------------------------------------------------------------------------------------------------------" << std::endl;
	LinesVector.clear();
	LinesVector.resize(row);
	std::cout << "Line 3: " << std::endl;
	for (int i = 0; i < row; ++i) {
		for (int j = 0; j < col; ++j) {
			if (i == 2 && j == 0) {
				LinesVector[i].push_back(3);
			}
			else
				if (i == 2 && j == 1) {
					LinesVector[i].push_back(3);
				}
				else
					if (i == 2 && j == 2) {
						LinesVector[i].push_back(3);
					}
					else
						if (i == 2 && j == 3) {
							LinesVector[i].push_back(3);
						}
						else
							if (i == 2 && j == 4) {
								LinesVector[i].push_back(3);
							}
							else {
								LinesVector[i].push_back(0);
							}
		}
	}
	for (int i = 0; i < LinesVector.size(); ++i) {
		for (int j = 0; j < LinesVector[i].size(); ++j) {
			std::cout << LinesVector[i][j] << "   ";
		}
		std::cout << std::endl;
	}
	std::cout << "-------------------------------------------------------------------------------------------------------------------------------------------------------" << std::endl;
	LinesVector.clear();
	LinesVector.resize(row);
	std::cout << "Line 4: " << std::endl;
	for (int i = 0; i < row; ++i) {
		for (int j = 0; j < col; ++j) {
			if (i == 0 && j == 0) {
				LinesVector[i].push_back(4);
			}
			else
				if (i == 1 && j == 1) {
					LinesVector[i].push_back(4);
				}
				else
					if (i == 2 && j == 2) {
						LinesVector[i].push_back(4);
					}
					else
						if (i == 1 && j == 3) {
							LinesVector[i].push_back(4);
						}
						else
							if (i == 0 && j == 4) {
								LinesVector[i].push_back(4);
							}
							else {
								LinesVector[i].push_back(0);
							}
		}
	}
	for (int i = 0; i < LinesVector.size(); ++i) {
		for (int j = 0; j < LinesVector[i].size(); ++j) {
			std::cout << LinesVector[i][j] << "   ";
		}
		std::cout << std::endl;
	}
	std::cout << "-------------------------------------------------------------------------------------------------------------------------------------------------------" << std::endl;
	LinesVector.clear();
	LinesVector.resize(row);
	std::cout << "Line 5: " << std::endl;
	for (int i = 0; i < row; ++i) {
		for (int j = 0; j < col; ++j) {
			if (i == 2 && j == 0) {
				LinesVector[i].push_back(5);
			}
			else
				if (i == 1 && j == 1) {
					LinesVector[i].push_back(5);
				}
				else
					if (i == 0 && j == 2) {
						LinesVector[i].push_back(5);
					}
					else
						if (i == 1 && j == 3) {
							LinesVector[i].push_back(5);
						}
						else
							if (i == 2 && j == 4) {
								LinesVector[i].push_back(5);
							}
							else {
								LinesVector[i].push_back(0);
							}
		}
	}
	for (int i = 0; i < LinesVector.size(); ++i) {
		for (int j = 0; j < LinesVector[i].size(); ++j) {
			std::cout << LinesVector[i][j] << "   ";
		}
		std::cout << std::endl;
	}
	std::cout << "-------------------------------------------------------------------------------------------------------------------------------------------------------" << std::endl;
	LinesVector.clear();
}